

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O2

int Abc_SclHasBufferFanout(Abc_Obj_t *pObj)

{
  void *pvVar1;
  long lVar2;
  
  lVar2 = 0;
  while( true ) {
    if ((pObj->vFanouts).nSize <= lVar2) {
      return 0;
    }
    pvVar1 = pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar2]];
    if (((*(uint *)((long)pvVar1 + 0x14) & 0xf) == 7) && (*(int *)((long)pvVar1 + 0x1c) == 1))
    break;
    lVar2 = lVar2 + 1;
  }
  return 1;
}

Assistant:

int Abc_SclHasBufferFanout( Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanout;
    int i;
    Abc_ObjForEachFanout( pObj, pFanout, i )
        if ( Abc_ObjIsBuffer(pFanout) )
            return 1;
    return 0;
}